

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

Fraig_NodeVec_t * Fraig_Dfs(Fraig_Man_t *pMan,int fEquiv)

{
  Fraig_NodeVec_t *vNodes;
  long lVar1;
  
  pMan->nTravIds = pMan->nTravIds + 1;
  vNodes = Fraig_NodeVecAlloc(100);
  for (lVar1 = 0; lVar1 < pMan->vOutputs->nSize; lVar1 = lVar1 + 1) {
    Fraig_Dfs_rec(pMan,(Fraig_Node_t *)((ulong)pMan->vOutputs->pArray[lVar1] & 0xfffffffffffffffe),
                  vNodes,fEquiv);
  }
  return vNodes;
}

Assistant:

Fraig_NodeVec_t * Fraig_Dfs( Fraig_Man_t * pMan, int fEquiv )
{
    Fraig_NodeVec_t * vNodes;
    int i;
    pMan->nTravIds++;
    vNodes = Fraig_NodeVecAlloc( 100 );
    for ( i = 0; i < pMan->vOutputs->nSize; i++ )
        Fraig_Dfs_rec( pMan, Fraig_Regular(pMan->vOutputs->pArray[i]), vNodes, fEquiv );
    return vNodes;
}